

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapParse.c
# Opt level: O3

void Amap_LibParseTest(char *pFileName)

{
  int iVar1;
  Amap_Lib_t *p;
  long lVar2;
  long lVar3;
  int level;
  timespec ts;
  timespec local_20;
  
  iVar1 = clock_gettime(3,&local_20);
  if (iVar1 < 0) {
    lVar2 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_20.tv_nsec),8);
    lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_20.tv_sec * -1000000;
  }
  p = Amap_LibReadFile(pFileName,0);
  if (p != (Amap_Lib_t *)0x0) {
    Amap_LibParseEquations(p,0);
    Amap_LibFree(p);
    Abc_Print((int)p,"%s =","Total time");
    level = 3;
    iVar1 = clock_gettime(3,&local_20);
    if (iVar1 < 0) {
      lVar3 = -1;
    }
    else {
      lVar3 = local_20.tv_nsec / 1000 + local_20.tv_sec * 1000000;
    }
    Abc_Print(level,"%9.2f sec\n",(double)(lVar3 + lVar2) / 1000000.0);
  }
  return;
}

Assistant:

void Amap_LibParseTest( char * pFileName )
{
    int fVerbose = 0;
    Amap_Lib_t * p;
    abctime clk = Abc_Clock();
    p = Amap_LibReadFile( pFileName, fVerbose );
    if ( p == NULL )
        return;
    Amap_LibParseEquations( p, fVerbose );
    Amap_LibFree( p );
    ABC_PRT( "Total time", Abc_Clock() - clk );
}